

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_7::TwoLevelIterator::status(TwoLevelIterator *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  long *plVar2;
  bool bVar3;
  void *local_30;
  
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x50))(&local_30);
  if (local_30 == (void *)0x0) {
    plVar2 = *(long **)(in_RSI + 0x78);
    if (plVar2 == (long *)0x0) {
      bVar3 = false;
    }
    else {
      (**(code **)(*plVar2 + 0x50))(&local_30,plVar2);
      bVar3 = local_30 != (void *)0x0;
      if (local_30 != (void *)0x0) {
        operator_delete__(local_30);
      }
    }
    if (!bVar3) {
      if (*(char **)(in_RSI + 0x50) == (char *)0x0) {
        pp_Var1 = (_func_int **)0x0;
      }
      else {
        pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x50));
      }
      (this->super_Iterator)._vptr_Iterator = pp_Var1;
      return (Status)(char *)this;
    }
    plVar2 = *(long **)(in_RSI + 0x78);
  }
  else {
    operator_delete__(local_30);
    plVar2 = *(long **)(in_RSI + 0x58);
  }
  (**(code **)(*plVar2 + 0x50))(this);
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }